

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O2

void __thiscall
QtMWidgets::NavigationButton::paintEvent(NavigationButton *this,QPaintEvent *param_1)

{
  Direction DVar1;
  int iVar2;
  int iVar3;
  NavigationButtonPrivate *pNVar4;
  uint flags;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  QRect QVar10;
  QPainter p;
  QRect local_b8;
  QRect local_a8;
  QArrayDataPointer<char16_t> local_98;
  QString t;
  QStyleOption opt;
  
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)&p,true);
  QVar10 = QWidget::rect((QWidget *)this);
  local_b8.x1 = 0;
  local_b8.y1 = 0;
  local_b8.x2 = -1;
  local_b8.y2 = -1;
  local_a8.x1 = 0;
  local_a8.y1 = 0;
  local_a8.x2 = -1;
  local_a8.y2 = -1;
  iVar2 = FingerGeometry::width();
  iVar3 = FingerGeometry::height();
  iVar5 = (int)((double)((ulong)((double)iVar2 / 5.0) & 0x8000000000000000 | (ulong)DAT_001873c0) +
               (double)iVar2 / 5.0);
  iVar6 = (int)((double)((ulong)((double)iVar3 / 3.0) & 0x8000000000000000 | (ulong)DAT_001873c0) +
               (double)iVar3 / 3.0);
  iVar3 = QVar10.y1;
  iVar7 = (QVar10.y2 - iVar3) + 1;
  iVar2 = (iVar7 - iVar6) / 2;
  DVar1 = ((this->d).d)->direction;
  uVar8 = QVar10.x2;
  uVar9 = QVar10.x1;
  if (DVar1 == Left) {
    local_b8.y1 = iVar2 + iVar3;
    local_b8.x1 = ((uVar8 + 1) - uVar9) - iVar5;
    local_b8.y2 = iVar6 + -1 + local_b8.y1;
    local_b8.x2 = ~uVar9 + 1 + uVar8;
    local_a8.x1 = uVar9 + 10 + iVar5;
    flags = 0x981;
    local_a8.x2 = uVar8;
  }
  else {
    flags = 0x980;
    if (DVar1 != Right) goto LAB_00169254;
    local_b8.y1 = iVar2 + iVar3;
    local_b8.x1 = (uVar8 - iVar5) + 1;
    local_b8.y2 = local_b8.y1 + iVar6 + -1;
    local_b8.x2 = uVar8;
    flags = 0x982;
    local_a8.x2 = (uVar8 - iVar5) - 10;
    local_a8.x1 = uVar9;
  }
  local_a8.y1 = iVar3;
  local_a8.y2 = QVar10.y2;
LAB_00169254:
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  pNVar4 = (NavigationButtonPrivate *)this;
  QAbstractButton::text();
  NavigationButtonPrivate::makeString(&t,pNVar4,(QString *)&local_98,&local_a8,flags,&opt);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QPainter::setPen((QColor *)&p);
  QPainter::drawText((QRect *)&p,(int)&local_a8,(QString *)(ulong)flags,(QRect *)&t);
  pNVar4 = (this->d).d;
  if (pNVar4->direction == Left) {
    QPainter::rotate(180.0);
    QPainter::translate(&p,(double)(int)(~uVar8 + uVar9),(double)-iVar7);
    pNVar4 = (this->d).d;
  }
  drawArrow(&p,&local_b8,&pNVar4->color);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&t.d);
  QStyleOption::~QStyleOption(&opt);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
NavigationButton::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	const QRect r = rect();
	QRect arrowRect;
	QRect textRect;

	const int arrowWidth = qRound( (qreal) FingerGeometry::width() / 5.0 );
	const int arrowHeight = qRound( (qreal) FingerGeometry::height() / 3.0 );
	const int delta = ( r.height() - arrowHeight ) /2;

	int flags = Qt::TextSingleLine | Qt::TextShowMnemonic | Qt::AlignVCenter;

	switch( d->direction )
	{
		case Left :
		{
			arrowRect.setRect( r.width() - arrowWidth, r.y() + delta,
				arrowWidth, arrowHeight );

			textRect.setRect( r.x() + arrowWidth + c_offset, r.y(),
				r.width() - arrowWidth - c_offset, r.height() );

			flags |= Qt::AlignLeft;
		}
			break;

		case Right :
		{
			arrowRect.setRect( r.x() + r.width() - arrowWidth, r.y() + delta,
				arrowWidth, arrowHeight );

			textRect.setRect( r.x(), r.y(),
				r.width() - arrowWidth - c_offset, r.height() );

			flags |= Qt::AlignRight;
		}
			break;

		default :
			break;
	}

	QStyleOption opt;
	opt.initFrom( this );

	const QString t = d->makeString( text(), textRect, flags, opt );

	p.setPen( d->textColor );
	p.drawText( textRect, flags, t );

	if( d->direction == Left )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );
	}

	drawArrow( &p, arrowRect, d->color );
}